

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorSet::MergePartialFromCodedStream
          (FileDescriptorSet *this,CodedInputStream *input)

{
  uint8 uVar1;
  int iVar2;
  uint8 *puVar3;
  void **ppvVar4;
  bool bVar5;
  Limit limit;
  FileDescriptorProto *this_00;
  uint32 tag;
  int iVar6;
  uint32 local_3c;
  UnknownFieldSet *local_38;
  
  local_38 = &this->_unknown_fields_;
  do {
    while( true ) {
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (tag = (uint32)(char)*puVar3, -1 < (char)*puVar3)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar3 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 10) break;
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      bVar5 = internal::WireFormat::SkipField(input,tag,local_38);
      if (!bVar5) {
        return false;
      }
    }
    while( true ) {
      iVar2 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
      iVar6 = (this->file_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar6) {
        ppvVar4 = (this->file_).super_RepeatedPtrFieldBase.elements_;
        (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        this_00 = (FileDescriptorProto *)ppvVar4[iVar2];
      }
      else {
        if (iVar6 == (this->file_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->file_).super_RepeatedPtrFieldBase,iVar6 + 1);
          iVar6 = (this->file_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->file_).super_RepeatedPtrFieldBase.allocated_size_ = iVar6 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>::New();
        ppvVar4 = (this->file_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
        (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar4[iVar2] = this_00;
      }
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (uVar1 = *puVar3, -1 < (char)uVar1)) {
        input->buffer_ = puVar3 + 1;
        local_3c = (int)(char)uVar1;
      }
      else {
        bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_3c);
        if (!bVar5) {
          return false;
        }
      }
      iVar2 = input->recursion_depth_;
      input->recursion_depth_ = iVar2 + 1;
      if (input->recursion_limit_ <= iVar2) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_3c);
      bVar5 = FileDescriptorProto::MergePartialFromCodedStream(this_00,input);
      if (!bVar5) {
        return false;
      }
      if (input->legitimate_message_end_ != true) {
        return false;
      }
      io::CodedInputStream::PopLimit(input,limit);
      if (0 < input->recursion_depth_) {
        input->recursion_depth_ = input->recursion_depth_ + -1;
      }
      puVar3 = input->buffer_;
      if ((input->buffer_end_ <= puVar3) || (*puVar3 != '\n')) break;
      input->buffer_ = puVar3 + 1;
    }
    if ((puVar3 == input->buffer_end_) &&
       ((input->buffer_size_after_limit_ != 0 || (input->total_bytes_read_ == input->current_limit_)
        ))) {
      input->last_tag_ = 0;
      input->legitimate_message_end_ = true;
      return true;
    }
  } while( true );
}

Assistant:

bool FileDescriptorSet::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.FileDescriptorProto file = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_file:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_file()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(10)) goto parse_file;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}